

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::PFor2008::decodeArray
          (PFor2008 *this,uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  size_t sVar2;
  logic_error *this_00;
  uint32_t *in_RCX;
  uint32_t *in_00;
  size_t in_RDX;
  uint *in_RSI;
  PFor2008 *in_RDI;
  ulong *in_R8;
  uint32_t maxb;
  size_t thisnvalue;
  size_t totalnvalue;
  uint32_t *finalin;
  ulong local_40;
  uint *local_8;
  
  local_8 = in_RSI + 1;
  *in_R8 = (ulong)*in_RSI;
  if (*in_R8 != 0) {
    for (local_40 = 0; local_40 < *in_R8; local_40 = (sVar2 - local_40) + local_40) {
      sVar2 = *in_R8;
      in_00 = local_8 + 1;
      uVar1 = *local_8;
      if (uVar1 == 0x20) {
        local_8 = __decodeArray<unsigned_int>(in_RDI,in_00,in_RDX,in_RCX,in_R8);
      }
      else if (uVar1 == 0x10) {
        local_8 = __decodeArray<unsigned_short>(in_RDI,in_00,in_RDX,in_RCX,in_R8);
      }
      else {
        if (uVar1 != 8) {
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_00,"corrupted?");
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        local_8 = __decodeArray<unsigned_char>(in_RDI,in_00,in_RDX,in_RCX,in_R8);
      }
      in_RCX = in_RCX + (sVar2 - local_40);
    }
    *in_R8 = local_40;
  }
  return local_8;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t len,
                              uint32_t *out, size_t &nvalue) override {
    nvalue = *in++;
    if (nvalue == 0)
      return in;
#ifndef NDEBUG
    const uint32_t *const initin = in;
#endif
    const uint32_t *const finalin = in + len;
    size_t totalnvalue(0);
    while (totalnvalue < nvalue) {
      size_t thisnvalue = nvalue - totalnvalue;
#ifndef NDEBUG
      const uint32_t *const befin(in);
#endif
      assert(finalin <= len + in);
      const uint32_t maxb = *in++;
      if (maxb == 32) {
        in = __decodeArray<uint32_t>(in, finalin - in, out, thisnvalue);
      } else if (maxb == 16) {
        in = __decodeArray<uint16_t>(in, finalin - in, out, thisnvalue);
      } else if (maxb == 8) {
        in = __decodeArray<uint8_t>(in, finalin - in, out, thisnvalue);
      } else {
        throw std::logic_error("corrupted?");
      }
      assert(in > befin);
      assert(in <= finalin);
      out += thisnvalue;
      totalnvalue += thisnvalue;
      assert(totalnvalue <= nvalue);
    }
    assert(in <= len + initin);
    assert(in <= finalin);
    nvalue = totalnvalue;
    return in;
  }